

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionParser.cxx
# Opt level: O1

void __thiscall
cmGeneratorExpressionParser::ParseContent
          (cmGeneratorExpressionParser *this,
          vector<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
          *result)

{
  pointer *pppcVar1;
  cmGeneratorExpressionEvaluator *pcVar2;
  uint uVar3;
  const_iterator it;
  iterator __position;
  pointer ppcVar4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  int iVar7;
  cmGeneratorExpressionToken *pcVar8;
  cmGeneratorExpressionEvaluator *n;
  cmGeneratorExpressionEvaluator *local_18;
  
  it._M_current = (this->it)._M_current;
  if (it._M_current ==
      (this->Tokens).
      super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("this->it != this->Tokens.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                  ,0xd1,
                  "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                 );
  }
  uVar3 = (it._M_current)->TokenType;
  if (uVar3 - 2 < 3) {
    if (this->NestingLevel != 0) {
      __assert_fail("false && \"Got unexpected syntax token.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf5,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    extendText(result,it);
    pcVar8 = (this->it)._M_current;
    if (pcVar8 == (this->Tokens).
                  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xf7,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
  }
  else {
    if (uVar3 == 1) {
      (this->it)._M_current = it._M_current + 1;
      ParseGeneratorExpression(this,result);
      return;
    }
    if (uVar3 != 0) {
      __assert_fail("false && \"Unhandled token in generator expression.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xfb,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
    if ((this->NestingLevel == 0) &&
       (ppcVar4 = (result->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish,
       (result->
       super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
       )._M_impl.super__Vector_impl_data._M_start != ppcVar4)) {
      iVar7 = (*ppcVar4[-1]->_vptr_cmGeneratorExpressionEvaluator[2])();
      if (iVar7 == 0) {
        pcVar8 = (this->it)._M_current;
        pcVar2 = (result->
                 super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1] + 2;
        pcVar2->_vptr_cmGeneratorExpressionEvaluator =
             (_func_int **)((long)pcVar2->_vptr_cmGeneratorExpressionEvaluator + pcVar8->Length);
        if (pcVar8 == (this->Tokens).
                      super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("this->it != this->Tokens.end()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                        ,0xde,
                        "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                       );
        }
        goto LAB_0051fcdf;
      }
    }
    local_18 = (cmGeneratorExpressionEvaluator *)operator_new(0x18);
    pcVar8 = (this->it)._M_current;
    pp_Var5 = (_func_int **)pcVar8->Content;
    pp_Var6 = (_func_int **)pcVar8->Length;
    local_18->_vptr_cmGeneratorExpressionEvaluator =
         (_func_int **)&PTR__cmGeneratorExpressionEvaluator_00790be0;
    local_18[1]._vptr_cmGeneratorExpressionEvaluator = pp_Var5;
    local_18[2]._vptr_cmGeneratorExpressionEvaluator = pp_Var6;
    __position._M_current =
         (result->
         super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (result->
        super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>::
      _M_realloc_insert<cmGeneratorExpressionEvaluator*const&>
                ((vector<cmGeneratorExpressionEvaluator*,std::allocator<cmGeneratorExpressionEvaluator*>>
                  *)result,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppcVar1 = &(result->
                  super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
    pcVar8 = (this->it)._M_current;
    if (pcVar8 == (this->Tokens).
                  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("this->it != this->Tokens.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorExpressionParser.cxx"
                    ,0xe6,
                    "void cmGeneratorExpressionParser::ParseContent(std::vector<cmGeneratorExpressionEvaluator *> &)"
                   );
    }
  }
LAB_0051fcdf:
  (this->it)._M_current = pcVar8 + 1;
  return;
}

Assistant:

void cmGeneratorExpressionParser::ParseContent(
  std::vector<cmGeneratorExpressionEvaluator*>& result)
{
  assert(this->it != this->Tokens.end());
  switch (this->it->TokenType) {
    case cmGeneratorExpressionToken::Text: {
      if (this->NestingLevel == 0) {
        if (!result.empty() &&
            (*(result.end() - 1))->GetType() ==
              cmGeneratorExpressionEvaluator::Text) {
          // A comma in 'plain text' could have split text that should
          // otherwise be continuous. Extend the last text content instead of
          // creating a new one.
          TextContent* textContent =
            static_cast<TextContent*>(*(result.end() - 1));
          textContent->Extend(this->it->Length);
          assert(this->it != this->Tokens.end());
          ++this->it;
          return;
        }
      }
      cmGeneratorExpressionEvaluator* n =
        new TextContent(this->it->Content, this->it->Length);
      result.push_back(n);
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
    }
    case cmGeneratorExpressionToken::BeginExpression:
      assert(this->it != this->Tokens.end());
      ++this->it;
      this->ParseGeneratorExpression(result);
      return;
    case cmGeneratorExpressionToken::EndExpression:
    case cmGeneratorExpressionToken::ColonSeparator:
    case cmGeneratorExpressionToken::CommaSeparator:
      if (this->NestingLevel == 0) {
        extendText(result, this->it);
      } else {
        assert(false && "Got unexpected syntax token.");
      }
      assert(this->it != this->Tokens.end());
      ++this->it;
      return;
  }
  assert(false && "Unhandled token in generator expression.");
}